

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

CVmTimeZone * __thiscall CVmTimeZoneCache::parse_zone(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  CVmTimeZone *pCVar2;
  long in_RDX;
  void *in_RSI;
  char *in_RDI;
  CVmTimeZoneCache *in_stack_00000298;
  CVmTimeZoneCache *in_stack_fffffffffffffff8;
  
  if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
LAB_0034c6cf:
    pCVar2 = get_local_zone(in_stack_00000298);
  }
  else {
    if (in_RDX == 6) {
      iVar1 = memcmp(in_RSI,":local",6);
      if (iVar1 == 0) goto LAB_0034c6cf;
    }
    pCVar2 = parse_zone_2(in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI);
  }
  return pCVar2;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone(VMG_ const char *name, size_t len)
{
    /* treat a null, empty string, or ":local" as the local zone */
    if (name == 0 || len == 0
        || (len == 6 && memcmp(name, ":local", 6) == 0))
        return get_local_zone(vmg0_);

    /* look for all names other than the ":local" pseudo-name */
    return parse_zone_2(vmg_ name, len);
}